

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::moveAppend
          (QGenericArrayOps<OrderedScreen> *this,OrderedScreen *b,OrderedScreen *e)

{
  QSizeF *pQVar1;
  drmModePropertyBlobPtr *pp_Var2;
  QKmsPlane **ppQVar3;
  OrderedScreen *pOVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  _drmModeModeInfo *p_Var10;
  Data *pDVar11;
  QKmsPlane *pQVar12;
  qreal qVar13;
  qreal qVar14;
  undefined8 uVar15;
  drmModePropertyPtr p_Var16;
  drmModePropertyBlobPtr p_Var17;
  QSize QVar18;
  OrderedScreen *pOVar19;
  Representation RVar20;
  uint32_t uVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar24;
  undefined3 uVar25;
  bool bVar26;
  uint32_t uVar27;
  qsizetype qVar28;
  
  if ((b != e) && (b < e)) {
    pOVar4 = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
    qVar28 = (this->super_QArrayDataPointer<OrderedScreen>).size;
    do {
      pOVar4[qVar28].screen = b->screen;
      RVar20.m_i = (b->vinfo).virtualPos.xp.m_i;
      uVar5 = *(undefined8 *)((long)&(b->vinfo).virtualPos.xp.m_i + 1);
      pOVar4[qVar28].vinfo.virtualIndex = (b->vinfo).virtualIndex;
      pOVar4[qVar28].vinfo.virtualPos.xp = (Representation)RVar20.m_i;
      *(undefined8 *)((long)&pOVar4[qVar28].vinfo.virtualPos.xp.m_i + 1) = uVar5;
      pDVar6 = (b->vinfo).output.name.d.d;
      (b->vinfo).output.name.d.d = (Data *)0x0;
      pOVar4[qVar28].vinfo.output.name.d.d = pDVar6;
      pcVar7 = (b->vinfo).output.name.d.ptr;
      (b->vinfo).output.name.d.ptr = (char16_t *)0x0;
      pOVar4[qVar28].vinfo.output.name.d.ptr = pcVar7;
      qVar8 = (b->vinfo).output.name.d.size;
      (b->vinfo).output.name.d.size = 0;
      pOVar4[qVar28].vinfo.output.name.d.size = qVar8;
      uVar21 = (b->vinfo).output.crtc_index;
      uVar5 = *(undefined8 *)&(b->vinfo).output.crtc_id;
      qVar13 = (b->vinfo).output.physical_size.wd;
      qVar14 = (b->vinfo).output.physical_size.ht;
      iVar22 = (b->vinfo).output.preferred_mode;
      iVar23 = (b->vinfo).output.mode;
      uVar15 = *(undefined8 *)&(b->vinfo).output.mode_set;
      pOVar19 = pOVar4 + qVar28;
      (pOVar19->vinfo).output.connector_id = (b->vinfo).output.connector_id;
      (pOVar19->vinfo).output.crtc_index = uVar21;
      *(undefined8 *)(&(pOVar19->vinfo).output.connector_id + 2) = uVar5;
      pQVar1 = &pOVar4[qVar28].vinfo.output.physical_size;
      pQVar1->wd = qVar13;
      pQVar1->ht = qVar14;
      pOVar19 = pOVar4 + qVar28;
      (pOVar19->vinfo).output.preferred_mode = iVar22;
      (pOVar19->vinfo).output.mode = iVar23;
      *(undefined8 *)(&(pOVar19->vinfo).output.preferred_mode + 2) = uVar15;
      pOVar4[qVar28].vinfo.output.saved_crtc = (b->vinfo).output.saved_crtc;
      pDVar9 = (b->vinfo).output.modes.d.d;
      (b->vinfo).output.modes.d.d = (Data *)0x0;
      pOVar4[qVar28].vinfo.output.modes.d.d = pDVar9;
      p_Var10 = (b->vinfo).output.modes.d.ptr;
      (b->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar4[qVar28].vinfo.output.modes.d.ptr = p_Var10;
      qVar8 = (b->vinfo).output.modes.d.size;
      (b->vinfo).output.modes.d.size = 0;
      pOVar4[qVar28].vinfo.output.modes.d.size = qVar8;
      uVar24 = *(undefined4 *)&(b->vinfo).output.field_0x6c;
      p_Var16 = (b->vinfo).output.dpms_prop;
      p_Var17 = (b->vinfo).output.edid_blob;
      uVar5 = *(undefined8 *)&(b->vinfo).output.wants_forced_plane;
      uVar25 = *(undefined3 *)&(b->vinfo).output.field_0x81;
      uVar21 = (b->vinfo).output.forced_plane_id;
      bVar26 = (b->vinfo).output.forced_plane_set;
      uVar15 = *(undefined8 *)&(b->vinfo).output.field_0x89;
      pOVar19 = pOVar4 + qVar28;
      (pOVar19->vinfo).output.subpixel = (b->vinfo).output.subpixel;
      *(undefined4 *)&(pOVar19->vinfo).output.field_0x6c = uVar24;
      *(drmModePropertyPtr *)(&(pOVar19->vinfo).output.subpixel + 2) = p_Var16;
      pp_Var2 = &pOVar4[qVar28].vinfo.output.edid_blob;
      *pp_Var2 = p_Var17;
      pp_Var2[1] = (drmModePropertyBlobPtr)uVar5;
      pOVar19 = pOVar4 + qVar28;
      *(undefined3 *)&(pOVar19->vinfo).output.field_0x81 = uVar25;
      (pOVar19->vinfo).output.forced_plane_id = uVar21;
      (pOVar19->vinfo).output.forced_plane_set = bVar26;
      *(undefined8 *)(&(pOVar19->vinfo).output.field_0x81 + 8) = uVar15;
      pDVar6 = (b->vinfo).output.clone_source.d.d;
      (b->vinfo).output.clone_source.d.d = (Data *)0x0;
      pOVar4[qVar28].vinfo.output.clone_source.d.d = pDVar6;
      pcVar7 = (b->vinfo).output.clone_source.d.ptr;
      (b->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
      pOVar4[qVar28].vinfo.output.clone_source.d.ptr = pcVar7;
      qVar8 = (b->vinfo).output.clone_source.d.size;
      (b->vinfo).output.clone_source.d.size = 0;
      pOVar4[qVar28].vinfo.output.clone_source.d.size = qVar8;
      pDVar11 = (b->vinfo).output.available_planes.d.d;
      (b->vinfo).output.available_planes.d.d = (Data *)0x0;
      pOVar4[qVar28].vinfo.output.available_planes.d.d = pDVar11;
      pQVar12 = (b->vinfo).output.available_planes.d.ptr;
      (b->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar4[qVar28].vinfo.output.available_planes.d.ptr = pQVar12;
      qVar8 = (b->vinfo).output.available_planes.d.size;
      (b->vinfo).output.available_planes.d.size = 0;
      pOVar4[qVar28].vinfo.output.available_planes.d.size = qVar8;
      QVar18 = (b->vinfo).output.size;
      uVar21 = (b->vinfo).output.crtcIdPropertyId;
      uVar27 = (b->vinfo).output.modeIdPropertyId;
      uVar5 = *(undefined8 *)&(b->vinfo).output.activePropertyId;
      ppQVar3 = &pOVar4[qVar28].vinfo.output.eglfs_plane;
      *ppQVar3 = (b->vinfo).output.eglfs_plane;
      *(QSize *)(ppQVar3 + 1) = QVar18;
      pOVar19 = pOVar4 + qVar28;
      (pOVar19->vinfo).output.crtcIdPropertyId = uVar21;
      (pOVar19->vinfo).output.modeIdPropertyId = uVar27;
      *(undefined8 *)(&(pOVar19->vinfo).output.crtcIdPropertyId + 2) = uVar5;
      b = b + 1;
      qVar28 = (this->super_QArrayDataPointer<OrderedScreen>).size + 1;
      (this->super_QArrayDataPointer<OrderedScreen>).size = qVar28;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }